

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dos-op.c
# Opt level: O2

int dos_get_volume_label(hd_context *ctx,dos_disk *disk)

{
  uint8_t curpart;
  uchar *puVar1;
  _Bool _Var2;
  byte bVar3;
  uint32_t in_R8D;
  long lVar4;
  dos_disk *disk_00;
  bool bVar5;
  
  puVar1 = disk->first_sector;
  disk_00 = (dos_disk *)(puVar1 + 0x1be);
  lVar4 = 4;
  bVar3 = 0;
  while( true ) {
    bVar5 = lVar4 == 0;
    lVar4 = lVar4 + -1;
    if (bVar5) break;
    curpart = (uint8_t)(disk_00->super).dev_fd;
    if ((((curpart != '\0') && (curpart != '\x05')) && (curpart != '\x0f')) &&
       ((curpart == 'B' || (*(short *)(puVar1 + 0x1fe) == -0x55ab)))) {
      _Var2 = parse_master_partition
                        ((hd_context *)disk,disk_00,(com_parptition *)(ulong)bVar3,curpart,in_R8D);
      bVar3 = bVar3 + _Var2;
    }
    disk_00 = (dos_disk *)&(disk_00->super).name;
  }
  return (int)bVar3;
}

Assistant:

int dos_get_volume_label(hd_context *ctx, dos_disk *disk)
{
    com_mbr *mbr = (com_mbr *)disk->first_sector;

    uint8_t ret,curpart;
    curpart = 0;

    int i;
    for (i = 0; i < 4; i++)
    {
        ret = 0;
        if ( mbr->partition[i].pid == 0x05 || mbr->partition[i].pid == 0x0f )
        {
            ret = parse_extend_partition(ctx, disk, &(mbr->partition[i]), curpart, 0);
            if (ret)
                curpart = ret;
        } else if (mbr->partition[i].pid == 0x42)
        {
            ret = parse_extend_partition(ctx, disk, &(mbr->partition[i]), curpart, 0);
            if (ret)
                curpart = ret;
            else
            {
                if (parse_master_partition(ctx, disk, &(mbr->partition[i]), curpart, 0))
                    curpart++;
            }
        } else if (mbr->partition[i].pid != 0 && mbr->byEnding == 0xAA55)
        {
            if (parse_master_partition(ctx, disk, &(mbr->partition[i]), curpart, 0))
                curpart++;
        }
    }

    return curpart;
}